

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_functions.h
# Opt level: O2

void output_mat<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>
               (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *mat,ostream *stream)

{
  long lVar1;
  uint uVar2;
  ostream *poVar3;
  pointer pvVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = 0;
  while( true ) {
    uVar6 = (ulong)uVar5;
    pvVar4 = (mat->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(mat->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18) <= uVar6)
    break;
    uVar2 = 0;
    while( true ) {
      lVar1 = *(long *)&pvVar4[uVar6].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar4[uVar6].super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data + 8) - lVar1 >> 2) <= (ulong)uVar2)
      break;
      poVar3 = (ostream *)
               std::ostream::operator<<((ostream *)stream,*(float *)(lVar1 + (ulong)uVar2 * 4));
      std::operator<<(poVar3," ");
      uVar2 = uVar2 + 1;
      pvVar4 = (mat->
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    std::operator<<(stream,"\n");
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void output_mat(T mat, std::ostream & stream=std::clog) 
{
  for (unsigned int r = 0; r < mat.size(); ++ r)
  {
    for (unsigned int s = 0; s < mat[r].size(); ++s)
    {
      stream << mat[r][s] << " ";
    }
    stream << "\n";
  }
  return;
}